

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O2

void CB_ALGS::predict_or_learn<false>(cb *data,single_learner *base,example *ec)

{
  label *cs_ld;
  label_t lVar1;
  wclass *pwVar2;
  size_t sVar3;
  size_t i;
  cb_class *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  label ld;
  label local_48;
  
  local_48.costs._begin = (cb_class *)(ec->l).cs.costs._begin;
  local_48.costs._end = (cb_class *)(ec->l).cs.costs._end;
  local_48.costs.end_array = (cb_class *)(ec->l).cs.costs.end_array;
  local_48.costs.erase_count = (ec->l).cs.costs.erase_count;
  pcVar4 = GEN_CS::get_observed_cost(&local_48);
  (data->cbcs).known_cost = pcVar4;
  if ((pcVar4 != (cb_class *)0x0) && ((data->cbcs).num_actions <= pcVar4->action - 1)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"invalid action: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  cs_ld = &data->cb_cs_ld;
  GEN_CS::gen_cs_example<false>(&data->cbcs,ec,&local_48,cs_ld);
  if ((data->cbcs).cb_type != 1) {
    lVar1 = (label_t)(cs_ld->costs)._begin;
    pwVar2 = (data->cb_cs_ld).costs._end;
    sVar3 = (data->cb_cs_ld).costs.erase_count;
    (ec->l).cs.costs.end_array = (data->cb_cs_ld).costs.end_array;
    (ec->l).cs.costs.erase_count = sVar3;
    (ec->l).multi = lVar1;
    (ec->l).cs.costs._end = pwVar2;
    lVar7 = 0;
    LEARNER::learner<char,_example>::predict(base,ec,0);
    for (uVar6 = 0; uVar6 < (ulong)((long)local_48.costs._end - (long)local_48.costs._begin >> 4);
        uVar6 = uVar6 + 1) {
      *(undefined4 *)((long)&(local_48.costs._begin)->partial_prediction + lVar7) =
           *(undefined4 *)((long)&((cs_ld->costs)._begin)->partial_prediction + lVar7);
      lVar7 = lVar7 + 0x10;
    }
    (ec->l).cs.costs.end_array = (wclass *)local_48.costs.end_array;
    (ec->l).cs.costs.erase_count = local_48.costs.erase_count;
    (ec->l).cs.costs._begin = (wclass *)local_48.costs._begin;
    (ec->l).cs.costs._end = (wclass *)local_48.costs._end;
  }
  return;
}

Assistant:

void predict_or_learn(cb& data, single_learner& base, example& ec)
{
  CB::label ld = ec.l.cb;
  cb_to_cs& c = data.cbcs;
  c.known_cost = get_observed_cost(ld);
  if (c.known_cost != nullptr && (c.known_cost->action < 1 || c.known_cost->action > c.num_actions))
    cerr << "invalid action: " << c.known_cost->action << endl;

  // generate a cost-sensitive example to update classifiers
  gen_cs_example<is_learn>(c, ec, ld, data.cb_cs_ld);

  if (c.cb_type != CB_TYPE_DM)
  {
    ec.l.cs = data.cb_cs_ld;

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    for (size_t i = 0; i < ld.costs.size(); i++)
      ld.costs[i].partial_prediction = data.cb_cs_ld.costs[i].partial_prediction;
    ec.l.cb = ld;
  }
}